

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

SpectrumMixTexture *
pbrt::SpectrumMixTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  SpectrumMixTexture *pSVar1;
  ParameterDictionary *in_RCX;
  string *in_RSI;
  SpectrumHandle one;
  SpectrumHandle zero;
  SpectrumHandle *in_stack_fffffffffffffeb8;
  SpectrumHandle *in_stack_fffffffffffffec0;
  double *in_stack_fffffffffffffec8;
  FloatTextureHandle *args_2;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  SpectrumType spectrumType;
  string *name;
  TextureParameterDictionary *this;
  Allocator alloc_00;
  TextureParameterDictionary *this_00;
  Allocator in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  string local_f8 [40];
  ParameterDictionary *local_d0;
  undefined1 local_b9 [41];
  ParameterDictionary *local_90;
  undefined1 local_69 [41];
  undefined8 local_40;
  undefined8 local_30;
  string *local_18;
  ParameterDictionary *local_8;
  
  spectrumType = (SpectrumType)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_30 = 0;
  this = (TextureParameterDictionary *)&stack0xfffffffffffffff8;
  local_18 = in_RSI;
  local_8 = in_RCX;
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
            (in_stack_fffffffffffffec0,(ConstantSpectrum *)in_stack_fffffffffffffeb8);
  local_40 = 0x3ff0000000000000;
  pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,double>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  SpectrumHandle::TaggedPointer<pbrt::ConstantSpectrum>
            (in_stack_fffffffffffffec0,(ConstantSpectrum *)in_stack_fffffffffffffeb8);
  this_00 = (TextureParameterDictionary *)local_69;
  alloc_00.memoryResource = (memory_resource *)local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8.memoryResource,
             (allocator<char> *)this_00);
  SpectrumHandle::SpectrumHandle(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_90 = local_8;
  TextureParameterDictionary::GetSpectrumTexture
            (this_00,(string *)alloc_00.memoryResource,(SpectrumHandle *)this,spectrumType,
             in_stack_fffffffffffffef8);
  name = (string *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8.memoryResource,
             (allocator<char> *)this_00);
  SpectrumHandle::SpectrumHandle(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_d0 = local_8;
  TextureParameterDictionary::GetSpectrumTexture
            (this_00,(string *)alloc_00.memoryResource,(SpectrumHandle *)this,
             (SpectrumType)((ulong)name >> 0x20),in_stack_fffffffffffffef8);
  args_2 = (FloatTextureHandle *)&stack0xffffffffffffff07;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8.memoryResource,
             (allocator<char> *)this_00);
  TextureParameterDictionary::GetFloatTexture(this,name,(Float)((ulong)local_18 >> 0x20),alloc_00);
  pSVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SpectrumMixTexture,pbrt::SpectrumTextureHandle,pbrt::SpectrumTextureHandle,pbrt::FloatTextureHandle>
                     ((polymorphic_allocator<std::byte> *)this,(SpectrumTextureHandle *)name,
                      (SpectrumTextureHandle *)local_18,args_2);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  return pSVar1;
}

Assistant:

SpectrumMixTexture *SpectrumMixTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    SpectrumHandle zero = alloc.new_object<ConstantSpectrum>(0.);
    SpectrumHandle one = alloc.new_object<ConstantSpectrum>(1.);
    return alloc.new_object<SpectrumMixTexture>(
        parameters.GetSpectrumTexture("tex1", zero, SpectrumType::Reflectance, alloc),
        parameters.GetSpectrumTexture("tex2", one, SpectrumType::Reflectance, alloc),
        parameters.GetFloatTexture("amount", 0.5f, alloc));
}